

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-blows.c
# Opt level: O0

void melee_effect_timed(melee_effect_handler_context_t *context,wchar_t type,wchar_t amount,
                       wchar_t of_flag,_Bool save,char *save_msg)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t local_2c;
  wchar_t mon_tmd_effect;
  char *save_msg_local;
  _Bool save_local;
  wchar_t of_flag_local;
  wchar_t amount_local;
  wchar_t type_local;
  melee_effect_handler_context_t *context_local;
  
  _Var1 = monster_damage_target(context,false);
  if (!_Var1) {
    if (context->t_mon == (monster *)0x0) {
      if ((save) && (wVar2 = Rand_div(100), wVar2 < (context->p->state).skills[3])) {
        if (save_msg != (char *)0x0) {
          msg("%s",save_msg);
        }
        context->obvious = true;
      }
      else {
        _Var1 = player_inc_timed(context->p,type,amount,true,true,true);
        if (_Var1) {
          context->obvious = true;
        }
        update_smart_learn(context->mon,context->p,of_flag,L'\0',L'\xffffffff');
      }
    }
    else {
      local_2c = L'\xffffffff';
      switch(type) {
      case L'\x02':
        local_2c = L'\x01';
        break;
      case L'\x03':
        local_2c = L'\x06';
        break;
      case L'\x04':
        local_2c = L'\x02';
        break;
      case L'\x05':
        local_2c = L'\x03';
      }
      if (L'\xffffffff' < local_2c) {
        mon_inc_timed(context->t_mon,local_2c,amount,L'\0');
        context->obvious = true;
      }
    }
  }
  return;
}

Assistant:

static void melee_effect_timed(melee_effect_handler_context_t *context,
							   int type, int amount, int of_flag, bool save,
							   const char *save_msg)
{
	/* Take damage */
	if (monster_damage_target(context, false)) return;

	/* Handle status */
	if (context->t_mon) {
		/* Translate to monster timed effect */
		int mon_tmd_effect = -1;

		/* Will do until monster and player timed effects are fused */
		switch (type) {
			case TMD_CONFUSED: {
				mon_tmd_effect = MON_TMD_CONF;
				break;
			}
			case TMD_PARALYZED: {
				mon_tmd_effect = MON_TMD_HOLD;
				break;
			}
			case TMD_BLIND: {
				mon_tmd_effect = MON_TMD_STUN;
				break;
			}
			case TMD_AFRAID: {
				mon_tmd_effect = MON_TMD_FEAR;
				break;
			}
			default: {
				break;
			}
		}
		if (mon_tmd_effect >= 0) {
			mon_inc_timed(context->t_mon, mon_tmd_effect, amount, 0);
			context->obvious = true;
		}
	} else if (save && randint0(100) < context->p->state.skills[SKILL_SAVE]) {
		/* Attempt a saving throw if desired. */
		if (save_msg != NULL) {
			msg("%s", save_msg);
		}
		context->obvious = true;
	} else {
		/* Increase timer for type. */
		if (player_inc_timed(context->p, type, amount, true, true,
				true)) {
			context->obvious = true;
		}

		/* Learn about the player */
		update_smart_learn(context->mon, context->p, of_flag, 0, -1);
	}
}